

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prngCOMBOStepR(void *buf,size_t count,void *state)

{
  prng_combo_st *in_RDX;
  ulong in_RSI;
  prng_combo_st *s;
  void *in_stack_ffffffffffffffd8;
  ulong local_10;
  
  local_10 = in_RSI;
  if (in_RDX->reserved != 0) {
    if (in_RSI <= in_RDX->reserved) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x11b697);
      in_RDX->reserved = in_RDX->reserved - in_RSI;
      return;
    }
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x11b6df);
    local_10 = in_RSI - in_RDX->reserved;
    in_RDX->reserved = 0;
  }
  for (; 3 < local_10; local_10 = local_10 - 4) {
    prngCOMBOStep(in_RDX);
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x11b741);
  }
  if (local_10 != 0) {
    prngCOMBOStep(in_RDX);
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x11b789);
    in_RDX->reserved = 4 - local_10;
  }
  return;
}

Assistant:

void prngCOMBOStepR(void* buf, size_t count, void* state)
{
	prng_combo_st* s = (prng_combo_st*)state;
	ASSERT(memIsValid(buf, count));
	ASSERT(memIsValid(s, sizeof(*s)));
	// есть резерв?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->r.block + 4 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->r.block + 4 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 4)
	{
		prngCOMBOStep(s);
		memCopy(buf, s->r.block, 4);
		buf = (octet*)buf + 4;
		count -= 4;
	}
	// неполный блок?
	if (count)
	{
		prngCOMBOStep(s);
		memCopy(buf, s->r.block, count);
		s->reserved = 4 - count;
	}
}